

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode http_setup_conn(connectdata *conn)

{
  Curl_easy *data;
  CURLcode CVar1;
  void *pvVar2;
  
  data = conn->data;
  pvVar2 = (*Curl_ccalloc)(1,0x218);
  if (pvVar2 == (void *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_mime_initpart((curl_mimepart *)((long)pvVar2 + 0x28),conn->data);
    (data->req).protop = pvVar2;
    CVar1 = CURLE_OK;
    if ((data->set).httpversion == 0x1e) {
      if ((conn->handler->flags & 1) == 0) {
        Curl_failf(data,"HTTP/3 requested for non-HTTPS URL");
        CVar1 = CURLE_URL_MALFORMAT;
      }
      else {
        conn->transport = TRNSPRT_QUIC;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode http_setup_conn(struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  struct Curl_easy *data = conn->data;
  DEBUGASSERT(data->req.protop == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  Curl_mime_initpart(&http->form, conn->data);
  data->req.protop = http;

  if(data->set.httpversion == CURL_HTTP_VERSION_3) {
    if(conn->handler->flags & PROTOPT_SSL)
      /* Only go HTTP/3 directly on HTTPS URLs. It needs a UDP socket and does
         the QUIC dance. */
      conn->transport = TRNSPRT_QUIC;
    else {
      failf(data, "HTTP/3 requested for non-HTTPS URL");
      return CURLE_URL_MALFORMAT;
    }
  }
  else {
    if(!CONN_INUSE(conn))
      /* if not already multi-using, setup connection details */
      Curl_http2_setup_conn(conn);
    Curl_http2_setup_req(data);
  }
  return CURLE_OK;
}